

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::injected_class_member::test_method(injected_class_member *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *prev;
  injected<Inject::service> *this_00;
  service *psVar4;
  undefined4 extraout_var;
  unique_id local_130;
  undefined8 local_128;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined1 local_c8 [8];
  injected<Inject::with_injected_member> p;
  context<0> c;
  provides<Inject::with_injected_member> b5;
  component<Inject::with_injected_member> b4;
  provides<Inject::service> b3;
  component<Inject::impl1> local_20;
  component<Inject::impl1> b2;
  component<Inject::service> b1;
  injected_class_member *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&b2);
  inject::context<0>::component<Inject::impl1>::component(&local_20);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&b4);
  inject::context<0>::component<Inject::with_injected_member>::component
            ((component<Inject::with_injected_member> *)&b5);
  inject::context<0>::component<Inject::with_injected_member>::
  provides<Inject::with_injected_member>::provides
            ((provides<Inject::with_injected_member> *)&c._parent);
  inject::context<0>::context((context<0> *)&p._ptr.pn);
  inject::context<0>::bind<Inject::service,Inject::impl1>((context<0> *)&p._ptr.pn);
  inject::context<0>::bind<Inject::with_injected_member>((context<0> *)&p._ptr.pn);
  inject::context<0>::injected<Inject::with_injected_member>::injected
            ((injected<Inject::with_injected_member> *)local_c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x1a0,&local_e8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,prev,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    this_00 = &inject::context<0>::injected<Inject::with_injected_member>::operator->
                         ((injected<Inject::with_injected_member> *)local_c8)->my_service;
    psVar4 = inject::context<0>::injected<Inject::service>::operator->(this_00);
    iVar3 = (**psVar4->_vptr_service)();
    local_128 = CONCAT44(extraout_var,iVar3);
    local_130 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_110,&local_120,0x1a0,1,2,&local_128,"p->my_service->id()",&local_130,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::with_injected_member>::~injected
            ((injected<Inject::with_injected_member> *)local_c8);
  inject::context<0>::~context((context<0> *)&p._ptr.pn);
  inject::context<0>::component<Inject::with_injected_member>::
  provides<Inject::with_injected_member>::~provides
            ((provides<Inject::with_injected_member> *)&c._parent);
  inject::context<0>::component<Inject::with_injected_member>::~component
            ((component<Inject::with_injected_member> *)&b5);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&b4);
  inject::context<0>::component<Inject::impl1>::~component(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&b2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(injected_class_member)
{
    context<>::component<service> b1;
    context<>::component<impl1> b2;
    context<>::component<impl1>::provides<service> b3;
    context<>::component<with_injected_member> b4;
    context<>::component<with_injected_member>::provides<with_injected_member> b5;

    context<> c;
    
    c.bind<service, impl1>();
    c.bind<with_injected_member>();

    context<>::injected<with_injected_member> p;
    BOOST_CHECK_EQUAL(p->my_service->id(), id_of<impl1>::id());
}